

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O1

pint p_test_case_sha3_224_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA3_224,0x1c,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_001041c0,
                    &DAT_001041e0,&DAT_00104200,
                    "e642824c3f8cf24ad09234ee7d3c766fc9a3a5168d0c94ad73b46fdf",
                    "8a24108b154ada21c9fd5574494479ba5c7e7ab76ef264ead0fcce33",
                    "d69335b93325192e516a912e6d19a15cb51c6ed5c15243e7a7fd653c",
                    "425fbad801bf675651dcf61af1138831480b562e714c70a2a0050ad3");
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha3_224_test)
{
	const puchar	hash_etalon_1[] = {230,  66, 130,  76,  63, 140, 242,  74, 208, 146,
					    52, 238, 125,  60, 118, 111, 201, 163, 165,  22,
					   141,  12, 148, 173, 115, 180, 111, 223};
	const puchar	hash_etalon_2[] = {138,  36,  16, 139,  21,  74, 218,  33, 201, 253,
					    85, 116,  73,  68, 121, 186,  92, 126, 122, 183,
					   110, 242, 100, 234, 208, 252, 206,  51};
	const puchar	hash_etalon_3[] = {214, 147,  53, 185,  51,  37,  25,  46,  81, 106,
					   145,  46, 109,  25, 161,  92, 181,  28, 110, 213,
					   193,  82,  67, 231, 167, 253, 101,  60};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA3_224,
			   28,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "e642824c3f8cf24ad09234ee7d3c766fc9a3a5168d0c94ad73b46fdf",
			   "8a24108b154ada21c9fd5574494479ba5c7e7ab76ef264ead0fcce33",
			   "d69335b93325192e516a912e6d19a15cb51c6ed5c15243e7a7fd653c",
			   "425fbad801bf675651dcf61af1138831480b562e714c70a2a0050ad3");

	p_libsys_shutdown ();
}